

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_glnodes.cpp
# Opt level: O0

bool LoadGLSegs(FileReader *lump)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  vertex_t *pvVar6;
  int iVar7;
  long lVar8;
  glseg3_t *pgVar9;
  ulong uVar10;
  line_t *plVar11;
  DWORD local_4c;
  int *local_38;
  glseg3_t *ml_1;
  glseg_t *ml;
  line_t *ldef;
  int i;
  char *data;
  FileReader *lump_local;
  
  lVar8 = FileReader::GetLength(lump);
  numsegs = (int)lVar8;
  pgVar9 = (glseg3_t *)operator_new__((long)numsegs);
  (*(lump->super_FileReaderBase)._vptr_FileReaderBase[4])(lump,0,0);
  (*(lump->super_FileReaderBase)._vptr_FileReaderBase[2])(lump,pgVar9,(long)numsegs);
  segs = (seg_t *)0x0;
  if (((format5 & 1U) == 0) && (pgVar9->v1 != 0x33644e67)) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)numsegs;
    numsegs = SUB164(auVar1 / ZEXT816(10),0);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)numsegs;
    uVar10 = SUB168(auVar2 * ZEXT816(0x48),0);
    if (SUB168(auVar2 * ZEXT816(0x48),8) != 0) {
      uVar10 = 0xffffffffffffffff;
    }
    segs = (seg_t *)operator_new__(uVar10);
    memset(segs,0,(long)numsegs * 0x48);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (long)numsegs;
    uVar10 = SUB168(auVar3 * ZEXT816(0x10),0);
    if (SUB168(auVar3 * ZEXT816(0x10),8) != 0) {
      uVar10 = 0xffffffffffffffff;
    }
    glsegextras = (glsegextra_t *)operator_new__(uVar10);
    ml_1 = pgVar9;
    for (ldef._4_4_ = 0; pvVar6 = vertexes, ldef._4_4_ < numsegs; ldef._4_4_ = ldef._4_4_ + 1) {
      iVar7 = checkGLVertex((uint)(ushort)ml_1->v1);
      segs[ldef._4_4_].v1 = pvVar6 + iVar7;
      pvVar6 = vertexes;
      iVar7 = checkGLVertex((uint)*(ushort *)((long)&ml_1->v1 + 2));
      segs[ldef._4_4_].v2 = pvVar6 + iVar7;
      if (ml_1->linedef == 0xffff) {
        local_4c = 0xffffffff;
      }
      else {
        local_4c = (DWORD)ml_1->linedef;
      }
      glsegextras[ldef._4_4_].PartnerSeg = local_4c;
      if ((short)ml_1->v2 == -1) {
        segs[ldef._4_4_].linedef = (line_t *)0x0;
        segs[ldef._4_4_].sidedef = (side_t *)0x0;
        segs[ldef._4_4_].frontsector = (sector_t *)0x0;
        segs[ldef._4_4_].backsector = (sector_t *)0x0;
      }
      else {
        plVar11 = lines + (ushort)ml_1->v2;
        segs[ldef._4_4_].linedef = plVar11;
        *(undefined2 *)((long)&ml_1->v2 + 2) = *(undefined2 *)((long)&ml_1->v2 + 2);
        segs[ldef._4_4_].sidedef = plVar11->sidedef[*(ushort *)((long)&ml_1->v2 + 2)];
        if (plVar11->sidedef[*(ushort *)((long)&ml_1->v2 + 2)] == (side_t *)0x0) {
          segs[ldef._4_4_].frontsector = (sector_t *)0x0;
        }
        else {
          segs[ldef._4_4_].frontsector = plVar11->sidedef[*(ushort *)((long)&ml_1->v2 + 2)]->sector;
        }
        if (((plVar11->flags & 4) == 0) ||
           (plVar11->sidedef[(int)(*(ushort *)((long)&ml_1->v2 + 2) ^ 1)] == (side_t *)0x0)) {
          plVar11->flags = plVar11->flags & 0xfffffffb;
          segs[ldef._4_4_].backsector = (sector_t *)0x0;
        }
        else {
          segs[ldef._4_4_].backsector =
               plVar11->sidedef[(int)(*(ushort *)((long)&ml_1->v2 + 2) ^ 1)]->sector;
        }
      }
      ml_1 = (glseg3_t *)&ml_1->side;
    }
  }
  else {
    if ((format5 & 1U) == 0) {
      numsegs = numsegs + -4;
    }
    numsegs = (int)((ulong)(long)numsegs >> 4);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = (long)numsegs;
    uVar10 = SUB168(auVar4 * ZEXT816(0x48),0);
    if (SUB168(auVar4 * ZEXT816(0x48),8) != 0) {
      uVar10 = 0xffffffffffffffff;
    }
    segs = (seg_t *)operator_new__(uVar10);
    memset(segs,0,(long)numsegs * 0x48);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = (long)numsegs;
    uVar10 = SUB168(auVar5 * ZEXT816(0x10),0);
    if (SUB168(auVar5 * ZEXT816(0x10),8) != 0) {
      uVar10 = 0xffffffffffffffff;
    }
    glsegextras = (glsegextra_t *)operator_new__(uVar10);
    iVar7 = 4;
    if ((format5 & 1U) != 0) {
      iVar7 = 0;
    }
    local_38 = (int *)((long)&pgVar9->v1 + (long)iVar7);
    for (ldef._4_4_ = 0; pvVar6 = vertexes, ldef._4_4_ < numsegs; ldef._4_4_ = ldef._4_4_ + 1) {
      iVar7 = checkGLVertex3(*local_38);
      segs[ldef._4_4_].v1 = pvVar6 + iVar7;
      pvVar6 = vertexes;
      iVar7 = checkGLVertex3(local_38[1]);
      segs[ldef._4_4_].v2 = pvVar6 + iVar7;
      glsegextras[ldef._4_4_].PartnerSeg = local_38[3];
      if ((short)local_38[2] == -1) {
        segs[ldef._4_4_].linedef = (line_t *)0x0;
        segs[ldef._4_4_].sidedef = (side_t *)0x0;
        segs[ldef._4_4_].frontsector = (sector_t *)0x0;
        segs[ldef._4_4_].backsector = (sector_t *)0x0;
      }
      else {
        plVar11 = lines + *(ushort *)(local_38 + 2);
        segs[ldef._4_4_].linedef = plVar11;
        *(undefined2 *)((long)local_38 + 10) = *(undefined2 *)((long)local_38 + 10);
        segs[ldef._4_4_].sidedef = plVar11->sidedef[*(ushort *)((long)local_38 + 10)];
        if (plVar11->sidedef[*(ushort *)((long)local_38 + 10)] == (side_t *)0x0) {
          segs[ldef._4_4_].frontsector = (sector_t *)0x0;
        }
        else {
          segs[ldef._4_4_].frontsector = plVar11->sidedef[*(ushort *)((long)local_38 + 10)]->sector;
        }
        if (((plVar11->flags & 4) == 0) ||
           (plVar11->sidedef[(int)(*(ushort *)((long)local_38 + 10) ^ 1)] == (side_t *)0x0)) {
          plVar11->flags = plVar11->flags & 0xfffffffb;
          segs[ldef._4_4_].backsector = (sector_t *)0x0;
        }
        else {
          segs[ldef._4_4_].backsector =
               plVar11->sidedef[(int)(*(ushort *)((long)local_38 + 10) ^ 1)]->sector;
        }
      }
      local_38 = local_38 + 4;
    }
  }
  if (pgVar9 != (glseg3_t *)0x0) {
    operator_delete__(pgVar9);
  }
  return true;
}

Assistant:

static bool LoadGLSegs(FileReader * lump)
{
	char		*data;
	int			i;
	line_t		*ldef=NULL;
	
	numsegs = lump->GetLength();
	data= new char[numsegs];
	lump->Seek(0, SEEK_SET);
	lump->Read(data, numsegs);
	segs=NULL;

#ifdef _MSC_VER
	__try
#endif
	{
		if (!format5 && memcmp(data, "gNd3", 4))
		{
			numsegs/=sizeof(glseg_t);
			segs = new seg_t[numsegs];
			memset(segs,0,sizeof(seg_t)*numsegs);
			glsegextras = new glsegextra_t[numsegs];
			
			glseg_t * ml = (glseg_t*)data;
			for(i = 0; i < numsegs; i++)
			{							// check for gl-vertices
				segs[i].v1 = &vertexes[checkGLVertex(LittleShort(ml->v1))];
				segs[i].v2 = &vertexes[checkGLVertex(LittleShort(ml->v2))];
				
				glsegextras[i].PartnerSeg = ml->partner == 0xFFFF ? DWORD_MAX : LittleShort(ml->partner);
				if(ml->linedef != 0xffff)
				{
					ldef = &lines[LittleShort(ml->linedef)];
					segs[i].linedef = ldef;
	
					
					ml->side=LittleShort(ml->side);
					segs[i].sidedef = ldef->sidedef[ml->side];
					if (ldef->sidedef[ml->side] != NULL)
					{
						segs[i].frontsector = ldef->sidedef[ml->side]->sector;
					}
					else
					{
						segs[i].frontsector = NULL;
					}
					if (ldef->flags & ML_TWOSIDED && ldef->sidedef[ml->side^1] != NULL)
					{
						segs[i].backsector = ldef->sidedef[ml->side^1]->sector;
					}
					else
					{
						ldef->flags &= ~ML_TWOSIDED;
						segs[i].backsector = NULL;
					}
	
				}
				else
				{
					segs[i].linedef = NULL;
					segs[i].sidedef = NULL;
	
					segs[i].frontsector = NULL;
					segs[i].backsector  = NULL;
				}
				ml++;		
			}
		}
		else
		{
			if (!format5) numsegs-=4;
			numsegs/=sizeof(glseg3_t);
			segs = new seg_t[numsegs];
			memset(segs,0,sizeof(seg_t)*numsegs);
			glsegextras = new glsegextra_t[numsegs];
			
			glseg3_t * ml = (glseg3_t*)(data+ (format5? 0:4));
			for(i = 0; i < numsegs; i++)
			{							// check for gl-vertices
				segs[i].v1 = &vertexes[checkGLVertex3(LittleLong(ml->v1))];
				segs[i].v2 = &vertexes[checkGLVertex3(LittleLong(ml->v2))];
				
				glsegextras[i].PartnerSeg = LittleLong(ml->partner);
	
				if(ml->linedef != 0xffff) // skip minisegs 
				{
					ldef = &lines[LittleLong(ml->linedef)];
					segs[i].linedef = ldef;
	
					
					ml->side=LittleShort(ml->side);
					segs[i].sidedef = ldef->sidedef[ml->side];
					if (ldef->sidedef[ml->side] != NULL)
					{
						segs[i].frontsector = ldef->sidedef[ml->side]->sector;
					}
					else
					{
						segs[i].frontsector = NULL;
					}
					if (ldef->flags & ML_TWOSIDED && ldef->sidedef[ml->side^1] != NULL)
					{
						segs[i].backsector = ldef->sidedef[ml->side^1]->sector;
					}
					else
					{
						ldef->flags &= ~ML_TWOSIDED;
						segs[i].backsector = NULL;
					}
	
				}
				else
				{
					segs[i].linedef = NULL;
					segs[i].sidedef = NULL;
					segs[i].frontsector = NULL;
					segs[i].backsector  = NULL;
				}
				ml++;		
			}
		}
		delete [] data;
		return true;
	}
#ifdef _MSC_VER
	__except(1)
	{
		// Invalid data has the bad habit of requiring extensive checks here
		// so let's just catch anything invalid and output a message.
		// (at least under MSVC. GCC can't do SEH even for Windows... :( )
		Printf("Invalid GL segs. The BSP will have to be rebuilt.\n");
		delete [] data;
		delete [] segs;
		segs = NULL;
		return false;
	}
#endif
}